

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  XMLGrammarPoolImpl *this;
  ostream *poVar7;
  ulong uVar8;
  XMLSize_t XVar9;
  void *this_00;
  XSNamedMap<xercesc_4_0::XSObject> *pXVar10;
  char *pcVar11;
  code *pcVar12;
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  char16_t *local_6d0;
  XMLCh *nameSpace;
  StringList *pSStack_6c0;
  uint i;
  StringList *namespaces;
  XSModel *xsModel;
  char local_6a8 [7];
  bool updatedXSModel;
  char fURI [1000];
  char local_2b0 [8];
  ifstream fin;
  undefined1 local_a0 [6];
  bool parsedOneSchemaOkay;
  bool more;
  SCMPrintHandler handler;
  SAX2XMLReader *parser;
  XMLGrammarPool *grammarPool;
  char *pcStack_50;
  int argInd;
  char *xsdFile;
  bool schemaFullChecking;
  bool doList;
  XMLException *toCatch;
  int errorCode;
  char **argV_local;
  int argC_local;
  
  argV_local._4_4_ = 0;
  if (argC < 2) {
    usage();
    argV_local._4_4_ = 1;
  }
  else {
    pcVar12 = (code *)0x0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    bVar1 = false;
    xsdFile._6_1_ = 0;
    grammarPool._4_4_ = 1;
    while ((grammarPool._4_4_ < argC && (*argV[grammarPool._4_4_] == '-'))) {
      iVar6 = strcmp(argV[grammarPool._4_4_],"-?");
      if (iVar6 == 0) {
        usage();
        return 1;
      }
      pcVar11 = "-l";
      iVar6 = strcmp(argV[grammarPool._4_4_],"-l");
      pcVar12 = (code *)pcVar11;
      if (iVar6 == 0) {
LAB_00107d89:
        bVar1 = true;
      }
      else {
        pcVar11 = "-L";
        iVar6 = strcmp(argV[grammarPool._4_4_],"-L");
        pcVar12 = (code *)pcVar11;
        if (iVar6 == 0) goto LAB_00107d89;
        pcVar11 = "-f";
        iVar6 = strcmp(argV[grammarPool._4_4_],"-f");
        pcVar12 = (code *)pcVar11;
        if (iVar6 == 0) {
LAB_00107dcc:
          xsdFile._6_1_ = 1;
        }
        else {
          pcVar11 = "-F";
          iVar6 = strcmp(argV[grammarPool._4_4_],"-F");
          pcVar12 = (code *)pcVar11;
          if (iVar6 == 0) goto LAB_00107dcc;
          poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
          poVar7 = std::operator<<(poVar7,argV[grammarPool._4_4_]);
          poVar7 = std::operator<<(poVar7,"\', ignoring it\n");
          pcVar12 = std::endl<char,std::char_traits<char>>;
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
      }
      grammarPool._4_4_ = grammarPool._4_4_ + 1;
    }
    if (grammarPool._4_4_ == argC + -1) {
      handler.fSawErrors = false;
      handler._49_7_ = 0;
      this = (XMLGrammarPoolImpl *)
             xercesc_4_0::XMemory::operator_new((XMemory *)0x40,(ulong)pcVar12);
      xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl
                (this,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      handler._48_8_ =
           xercesc_4_0::XMLReaderFactory::createXMLReader
                     (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,(XMLGrammarPool *)this);
      (**(code **)(*(long *)handler._48_8_ + 0x60))
                (handler._48_8_,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,1);
      (**(code **)(*(long *)handler._48_8_ + 0x60))
                (handler._48_8_,&xercesc_4_0::XMLUni::fgXercesSchema,1);
      (**(code **)(*(long *)handler._48_8_ + 0x60))
                (handler._48_8_,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
      (**(code **)(*(long *)handler._48_8_ + 0x60))
                (handler._48_8_,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,xsdFile._6_1_);
      (**(code **)(*(long *)handler._48_8_ + 0x60))
                (handler._48_8_,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpacePrefixes,0);
      (**(code **)(*(long *)handler._48_8_ + 0x60))
                (handler._48_8_,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
      (**(code **)(*(long *)handler._48_8_ + 0x60))
                (handler._48_8_,&xercesc_4_0::XMLUni::fgXercesDynamic,1);
      (**(code **)(*(long *)handler._48_8_ + 0x68))
                (handler._48_8_,&xercesc_4_0::XMLUni::fgXercesScannerName,
                 &xercesc_4_0::XMLUni::fgSGXMLScanner);
      SCMPrintHandler::SCMPrintHandler((SCMPrintHandler *)local_a0);
      (**(code **)(*(long *)handler._48_8_ + 0x58))();
      bVar2 = true;
      bVar3 = false;
      std::ifstream::ifstream(local_2b0);
      if (bVar1) {
        std::ifstream::open(local_2b0,argV[grammarPool._4_4_],8);
      }
      bVar4 = std::ios::fail();
      if ((bVar4 & 1) == 0) {
LAB_00108112:
        if (bVar2) {
          memset(local_6a8,0,1000);
          if (!bVar1) {
            pcStack_50 = argV[grammarPool._4_4_];
            bVar2 = false;
            goto LAB_00108205;
          }
          bVar4 = std::ios::eof();
          if ((bVar4 & 1) == 0) goto LAB_0010816c;
        }
        if (bVar3) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "********** Printing out information from Schema **********");
          std::operator<<(poVar7,"\n\n");
          namespaces = (StringList *)(**(code **)(*(long *)this + 0x68))(this,(long)&xsModel + 7);
          if (namespaces == (StringList *)0x0) {
            poVar7 = std::operator<<((ostream *)&std::cout,"No XSModel to print");
            std::operator<<(poVar7,"\n\n");
          }
          else {
            pSStack_6c0 = xercesc_4_0::XSModel::getNamespaces((XSModel *)namespaces);
            for (nameSpace._4_4_ = 0; uVar8 = (ulong)nameSpace._4_4_,
                XVar9 = xercesc_4_0::BaseRefVectorOf<char16_t>::size
                                  ((BaseRefVectorOf<char16_t> *)pSStack_6c0), uVar8 < XVar9;
                nameSpace._4_4_ = nameSpace._4_4_ + 1) {
              std::operator<<((ostream *)&std::cout,"Processing Namespace:   ");
              local_6d0 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                                    ((BaseRefVectorOf<char16_t> *)pSStack_6c0,(ulong)nameSpace._4_4_
                                    );
              if ((local_6d0 != (char16_t *)0x0) && (*local_6d0 != L'\0')) {
                StrX::StrX((StrX *)&e,local_6d0);
                operator<<((ostream *)&std::cout,(StrX *)&e);
                StrX::~StrX((StrX *)&e);
              }
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "\n============================================");
              this_00 = (void *)std::ostream::operator<<
                                          (poVar7,std::endl<char,std::char_traits<char>>);
              std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
              pXVar10 = (XSNamedMap<xercesc_4_0::XSObject> *)
                        xercesc_4_0::XSModel::getComponentsByNamespace
                                  ((COMPONENT_TYPE)namespaces,(wchar16 *)0x2);
              processElements(pXVar10);
              pXVar10 = (XSNamedMap<xercesc_4_0::XSObject> *)
                        xercesc_4_0::XSModel::getComponentsByNamespace
                                  ((COMPONENT_TYPE)namespaces,(wchar16 *)0x3);
              processTypeDefinitions(pXVar10);
            }
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,
                          "Did not parse a schema document cleanly so not printing Schema for Schema XSModel information"
                         );
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        bVar1 = false;
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Cannot open the list file: ");
        poVar7 = std::operator<<(poVar7,argV[grammarPool._4_4_]);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        argV_local._4_4_ = 3;
        bVar1 = true;
      }
      std::ifstream::~ifstream(local_2b0);
      SCMPrintHandler::~SCMPrintHandler((SCMPrintHandler *)local_a0);
      if (!bVar1) {
        if (handler._48_8_ != 0) {
          (**(code **)(*(long *)handler._48_8_ + 8))();
        }
        if (this != (XMLGrammarPoolImpl *)0x0) {
          (**(code **)(*(long *)this + 8))();
        }
        xercesc_4_0::XMLPlatformUtils::Terminate();
        argV_local._4_4_ = 0;
      }
    }
    else {
      usage();
      argV_local._4_4_ = 1;
    }
  }
  return argV_local._4_4_;
LAB_0010816c:
  std::istream::getline(local_2b0,(long)local_6a8);
  if (local_6a8[0] != '\0') {
    pcStack_50 = local_6a8;
    poVar7 = std::operator<<((ostream *)&std::cerr,"==Parsing== ");
    poVar7 = std::operator<<(poVar7,pcStack_50);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
LAB_00108205:
    (**(code **)(*(long *)handler._48_8_ + 0x138))(handler._48_8_,pcStack_50,1);
    bVar5 = SCMPrintHandler::getSawErrors((SCMPrintHandler *)local_a0);
    if (bVar5) {
      SCMPrintHandler::resetErrors((SCMPrintHandler *)local_a0);
    }
    else {
      bVar3 = true;
    }
  }
  goto LAB_00108112;
}

Assistant:

int main(int argC, char* argV[])
{
    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    // cannot return out of catch-blocks lest exception-destruction
    // result in calls to destroyed memory handler!
    int errorCode = 0;
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        std::cerr   << "Error during initialization! Message:\n"
        << StrX(toCatch.getMessage()) << std::endl;
        errorCode = 2;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    bool							doList				= false;
    bool							schemaFullChecking	= false;
    const char*                     xsdFile             = 0;
    int argInd;

    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 1;
        }
        else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
        else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should be only one and only one parameter left, and that
    //  should be the file name.
    //
    if (argInd != argC - 1)
    {
        usage();
        return 1;
    }

    XMLGrammarPool *grammarPool = 0;
    SAX2XMLReader* parser = 0;
    try
    {
        grammarPool = new XMLGrammarPoolImpl(XMLPlatformUtils::fgMemoryManager);

        parser = XMLReaderFactory::createXMLReader(XMLPlatformUtils::fgMemoryManager, grammarPool);
        parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, true);
        parser->setFeature(XMLUni::fgXercesSchema, true);
        parser->setFeature(XMLUni::fgXercesHandleMultipleImports, true);
        parser->setFeature(XMLUni::fgXercesSchemaFullChecking, schemaFullChecking);
        parser->setFeature(XMLUni::fgSAX2CoreNameSpacePrefixes, false);
        parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
        parser->setFeature(XMLUni::fgXercesDynamic, true);
        parser->setProperty(XMLUni::fgXercesScannerName, (void *)XMLUni::fgSGXMLScanner);

        SCMPrintHandler handler;
        parser->setErrorHandler(&handler);

        bool more = true;
        bool parsedOneSchemaOkay = false;
        std::ifstream fin;

        // the input is a list file
        if (doList)
            fin.open(argV[argInd]);

        if (fin.fail()) {
            std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
            return 3;
        }

        while (more)
        {
            char fURI[1000];
            //initialize the array to zeros
            memset(fURI,0,sizeof(fURI));

            if (doList) {
                if (! fin.eof() ) {
                    fin.getline (fURI, sizeof(fURI));
                    if (!*fURI)
                        continue;
                    else {
                        xsdFile = fURI;
                        std::cerr << "==Parsing== " << xsdFile << std::endl;
                    }
                }
                else
                    break;
            }
            else {
                xsdFile = argV[argInd];
                more = false;
            }

            parser->loadGrammar(xsdFile, Grammar::SchemaGrammarType, true);
            if (handler.getSawErrors())
            {
                handler.resetErrors();
            }
            else
            {
                parsedOneSchemaOkay = true;
            }
        }

        if (parsedOneSchemaOkay)
        {
            std::cout << "********** Printing out information from Schema **********" << "\n\n";
            bool updatedXSModel;
            XSModel *xsModel = grammarPool->getXSModel(updatedXSModel);
            if (xsModel)
            {
                StringList *namespaces = xsModel->getNamespaces();
                for (unsigned i = 0; i < namespaces->size(); i++) {

                    std::cout << "Processing Namespace:   ";
                    const XMLCh *nameSpace = namespaces->elementAt(i);
                    if (nameSpace && *nameSpace)
                        std::cout << StrX(nameSpace);
                    std::cout << "\n============================================" << std::endl << std::endl;

                    processElements(xsModel->getComponentsByNamespace(XSConstants::ELEMENT_DECLARATION,
                                                                  nameSpace));
                    processTypeDefinitions(xsModel->getComponentsByNamespace(XSConstants::TYPE_DEFINITION,
                                                                         nameSpace));
                }
            }
            else
            {
                std::cout << "No XSModel to print" << "\n\n";
            }
        }
        else
        {
            std::cout << "Did not parse a schema document cleanly so not printing Schema for Schema XSModel information";
        }

        std::cout << std::endl;
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException during parsing: '" << xsdFile << "'\n" << std::endl;
        errorCode = 6;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xsdFile << "'\n"
        << "Exception message is:  \n"
        << StrX(e.getMessage()) << std::endl;
        errorCode = 4;
    }
    catch (...)
    {
        std::cerr << "\nUnexpected exception during parsing: '" << xsdFile << "'\n" << std::endl;
        errorCode = 5;
    }

    delete parser;
    delete grammarPool;
    XMLPlatformUtils::Terminate();

    return errorCode;
}